

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O3

void __thiscall QDataWidgetMapperPrivate::commitData(QDataWidgetMapperPrivate *this,QWidget *w)

{
  pointer pWVar1;
  pointer pWVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  QWidget *pQVar8;
  pointer pWVar9;
  
  if (this->submitPolicy != ManualSubmit) {
    pWVar1 = (this->widgetMap).
             super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pWVar2 = (this->widgetMap).
             super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pWVar1 != pWVar2) {
      lVar6 = 0;
      do {
        lVar3 = *(long *)((long)&(pWVar1->widget).wp.d + lVar6);
        if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
          pQVar8 = (QWidget *)0x0;
        }
        else {
          pQVar8 = *(QWidget **)((long)&(pWVar1->widget).wp.value + lVar6);
        }
        if (pQVar8 == w) {
          iVar5 = (int)(lVar6 >> 3) * -0x49249249;
          if (iVar5 == -1) {
            return;
          }
          uVar7 = (ulong)iVar5;
          uVar4 = ((long)pWVar2 - (long)pWVar1 >> 3) * 0x6db6db6db6db6db7;
          if (uVar7 <= uVar4 && uVar4 - uVar7 != 0) {
            commit(this,pWVar1 + uVar7);
            return;
          }
          commitData();
        }
        pWVar9 = (pointer)((long)&pWVar1[1].widget.wp.d + lVar6);
        lVar6 = lVar6 + 0x38;
      } while (pWVar9 != pWVar2);
    }
  }
  return;
}

Assistant:

void QDataWidgetMapperPrivate::commitData(QWidget *w)
{
    if (submitPolicy == QDataWidgetMapper::ManualSubmit)
        return;

    int idx = findWidget(w);
    if (idx == -1)
        return; // not our widget

    commit(widgetMap[idx]);
}